

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O3

int get_ext_tx_set(TX_SIZE tx_size,int is_inter,int use_reduced_set)

{
  byte bVar1;
  
  if ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    if ((0x18608UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      if (use_reduced_set == 0) {
        bVar1 = av1_ext_tx_set_lookup[(uint)is_inter]
                [(0x60604UL >> ((ulong)tx_size & 0x3f) & 1) != 0];
      }
      else {
        bVar1 = (is_inter == 0) + 1;
      }
    }
    else {
      bVar1 = is_inter != 0;
    }
  }
  else {
    bVar1 = 0;
  }
  return ext_tx_set_index[(uint)is_inter][bVar1];
}

Assistant:

static inline int get_ext_tx_set(TX_SIZE tx_size, int is_inter,
                                 int use_reduced_set) {
  const TxSetType set_type =
      av1_get_ext_tx_set_type(tx_size, is_inter, use_reduced_set);
  return ext_tx_set_index[is_inter][set_type];
}